

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O3

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetDeviceOutputSubsamples
          (VClient *this,string *i_rDeviceName,string *i_rDeviceOutputName,string *i_rComponentName,
          uint *o_rDeviceOutputSubsamples,bool *o_rbOccluded)

{
  long lVar1;
  size_t __n;
  pointer pbVar2;
  element_type *__n_00;
  pointer pVVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  uint *puVar7;
  bool *pbVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  VDeviceInfo *pVVar12;
  UInt64 UVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  pointer pVVar17;
  pointer pVVar18;
  pointer pVVar19;
  pointer pVVar20;
  Enum EVar21;
  VChannelInfo *rChannel;
  VClient *this_00;
  VClient *pVVar22;
  ulong uVar23;
  pointer i_rDeviceOutputName_00;
  uint i_DeviceOutputIndex;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_b4;
  ulong local_b0;
  ulong local_a8;
  UInt64 local_a0;
  VClient *local_98;
  uint local_8c;
  uint *local_88;
  bool *local_80;
  string *local_78;
  string *local_70;
  VChannelInfo *local_68;
  unique_lock<boost::recursive_mutex> local_60;
  undefined1 local_50 [32];
  
  local_60.m = &this->m_FrameMutex;
  local_60.is_locked = false;
  local_78 = i_rDeviceOutputName;
  local_70 = i_rComponentName;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_60);
  local_b4 = Success;
  ClientUtils::Clear(o_rDeviceOutputSubsamples);
  bVar9 = InitGet(this,&local_b4);
  EVar21 = local_b4;
  if ((bVar9) &&
     (pVVar12 = GetDevice(this,i_rDeviceName,&local_b4), EVar21 = local_b4,
     pVVar12 != (VDeviceInfo *)0x0)) {
    local_8c = pVVar12->m_DeviceID;
    local_a0 = pVVar12->m_FramePeriod;
    UVar13 = GetDeviceStartTick(this,local_8c);
    rChannel = (this->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (this->m_LatestFrame).m_Channels.
               super__Vector_base<ViconCGStream::VChannelInfo,_std::allocator<ViconCGStream::VChannelInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (rChannel != local_68) {
      lVar1 = (this->m_LatestFrame).m_Stream.m_FramePeriod;
      local_b0 = (ulong)(this->m_LatestFrame).m_Frame.m_FrameID * lVar1;
      local_a8 = lVar1 + local_b0;
      i_DeviceOutputIndex = 0;
      local_98 = this;
      local_88 = o_rDeviceOutputSubsamples;
      local_80 = o_rbOccluded;
      do {
        if ((rChannel->m_DeviceID == local_8c) &&
           ((__n = local_78->_M_string_length, __n == 0 ||
            (((rChannel->m_Name)._M_string_length == __n &&
             (iVar10 = bcmp((rChannel->m_Name)._M_dataplus._M_p,(local_78->_M_dataplus)._M_p,__n),
             iVar10 == 0)))))) {
          i_rDeviceOutputName_00 =
               (rChannel->m_ComponentNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (rChannel->m_ComponentNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (i_rDeviceOutputName_00 == pbVar2) {
            EVar21 = NoFrame;
            goto LAB_0012dc96;
          }
          do {
            this_00 = (VClient *)local_50;
            ClientUtils::AdaptDeviceOutputName
                      ((string *)this_00,i_rDeviceOutputName_00,i_DeviceOutputIndex);
            pVVar22 = (VClient *)local_50._0_8_;
            __n_00 = (element_type *)local_70->_M_string_length;
            if (__n_00 == (element_type *)local_50._8_8_) {
              if (__n_00 == (element_type *)0x0) {
                bVar9 = true;
              }
              else {
                this_00 = (VClient *)(local_70->_M_dataplus)._M_p;
                iVar10 = bcmp(this_00,(void *)local_50._0_8_,(size_t)__n_00);
                bVar9 = iVar10 == 0;
              }
            }
            else {
              bVar9 = false;
            }
            if (pVVar22 != (VClient *)(local_50 + 0x10)) {
              operator_delete(pVVar22);
              this_00 = pVVar22;
            }
            if (bVar9) {
              bVar9 = IsForcePlateForceChannel(this_00,rChannel);
              if (bVar9) {
                pVVar17 = (local_98->m_LatestFrame).m_Forces.
                          super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar3 = (local_98->m_LatestFrame).m_Forces.
                         super__Vector_base<ViconCGStream::VForceFrame,_std::allocator<ViconCGStream::VForceFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *local_88 = 0;
                bVar9 = true;
                if (pVVar17 == pVVar3) goto LAB_0012df85;
                uVar23 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                goto LAB_0012dd17;
              }
              bVar9 = IsForcePlateMomentChannel(this_00,rChannel);
              pbVar8 = local_80;
              puVar7 = local_88;
              if (bVar9) {
                pVVar18 = (local_98->m_LatestFrame).m_Moments.
                          super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar4 = (local_98->m_LatestFrame).m_Moments.
                         super__Vector_base<ViconCGStream::VMomentFrame,_std::allocator<ViconCGStream::VMomentFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *local_88 = 0;
                bVar9 = true;
                if (pVVar18 == pVVar4) goto LAB_0012e03b;
                uVar23 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                goto LAB_0012dda3;
              }
              bVar9 = IsForcePlateCoPChannel(this_00,rChannel);
              if (!bVar9) {
                pVVar20 = (local_98->m_LatestFrame).m_Voltages.
                          super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar6 = (local_98->m_LatestFrame).m_Voltages.
                         super__Vector_base<ViconCGStream::VVoltageFrame,_std::allocator<ViconCGStream::VVoltageFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                *puVar7 = 0;
                bVar9 = true;
                if (pVVar20 == pVVar6) goto LAB_0012e03b;
                uVar23 = (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(rChannel->m_ComponentNames).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                goto LAB_0012de9b;
              }
              pVVar19 = (local_98->m_LatestFrame).m_CentresOfPressure.
                        super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar5 = (local_98->m_LatestFrame).m_CentresOfPressure.
                       super__Vector_base<ViconCGStream::VCentreOfPressureFrame,_std::allocator<ViconCGStream::VCentreOfPressureFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              *puVar7 = 0;
              bVar9 = true;
              if (pVVar19 == pVVar5) goto LAB_0012e03b;
              uVar23 = (long)(rChannel->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rChannel->m_ComponentNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              goto LAB_0012de25;
            }
            i_rDeviceOutputName_00 = i_rDeviceOutputName_00 + 1;
            i_DeviceOutputIndex = i_DeviceOutputIndex + 1;
          } while (i_rDeviceOutputName_00 != pbVar2);
        }
        rChannel = rChannel + 1;
      } while (rChannel != local_68);
    }
    EVar21 = InvalidDeviceOutputName;
  }
  goto LAB_0012dc96;
  while (pVVar17 = pVVar17 + 1, pVVar17 != pVVar3) {
LAB_0012dd17:
    if (((pVVar17->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar17->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar17->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar23 - 1 < uVar14)) {
      if (uVar14 % uVar23 != 0) {
        pcVar16 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
        ;
        goto LAB_0012e0b8;
      }
      uVar15 = local_a0 / (uVar14 / uVar23);
      if (local_a0 % (uVar14 / uVar23) != 0) {
        pcVar16 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VForceFrame]"
        ;
        goto LAB_0012e0d7;
      }
      if (local_b0 < UVar13) {
        iVar10 = 0;
      }
      else {
        iVar10 = (int)((local_b0 + ~UVar13 + uVar15) / uVar15);
      }
      if (local_a8 < UVar13) {
        iVar11 = 0;
      }
      else {
        iVar11 = (int)((local_a8 + ~UVar13 + uVar15) / uVar15);
      }
      *local_88 = iVar11 - iVar10;
      bVar9 = false;
      break;
    }
  }
LAB_0012df85:
  *local_80 = bVar9;
  goto LAB_0012e03d;
  while (pVVar18 = pVVar18 + 1, pVVar18 != pVVar4) {
LAB_0012dda3:
    if (((pVVar18->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar18->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar18->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar23 - 1 < uVar14)) {
      if (uVar14 % uVar23 != 0) {
        pcVar16 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
        ;
        goto LAB_0012e0b8;
      }
      uVar15 = local_a0 / (uVar14 / uVar23);
      if (local_a0 % (uVar14 / uVar23) == 0) goto LAB_0012dfeb;
      pcVar16 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VMomentFrame]"
      ;
      goto LAB_0012e0d7;
    }
  }
  goto LAB_0012e03b;
LAB_0012de9b:
  if (((pVVar20->m_DeviceID != rChannel->m_DeviceID) ||
      (pVVar20->m_ChannelID != rChannel->m_ChannelID)) ||
     (uVar14 = (long)(pVVar20->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pVVar20->m_Samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2, uVar14 <= uVar23 - 1))
  goto LAB_0012debc;
  if (uVar14 % uVar23 != 0) {
    pcVar16 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
    ;
LAB_0012e0b8:
    __assert_fail("NumberOfSampleComponents % Components == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xeed,pcVar16);
  }
  uVar15 = local_a0 / (uVar14 / uVar23);
  if (local_a0 % (uVar14 / uVar23) != 0) {
    pcVar16 = 
    "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VVoltageFrame]"
    ;
LAB_0012e0d7:
    __assert_fail("i_DevicePeriod % NumSamples == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCore/CoreClient.cpp"
                  ,0xef1,pcVar16);
  }
LAB_0012dfeb:
  if (local_b0 < UVar13) {
    iVar10 = 0;
  }
  else {
    iVar10 = (int)((local_b0 + ~UVar13 + uVar15) / uVar15);
  }
  if (local_a8 < UVar13) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)((local_a8 + ~UVar13 + uVar15) / uVar15);
  }
  *puVar7 = iVar11 - iVar10;
  bVar9 = false;
  goto LAB_0012e03b;
LAB_0012debc:
  pVVar20 = pVVar20 + 1;
  if (pVVar20 == pVVar6) goto LAB_0012e03b;
  goto LAB_0012de9b;
  while (pVVar19 = pVVar19 + 1, pVVar19 != pVVar5) {
LAB_0012de25:
    if (((pVVar19->m_DeviceID == rChannel->m_DeviceID) &&
        (pVVar19->m_ChannelID == rChannel->m_ChannelID)) &&
       (uVar14 = (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pVVar19->m_Samples).super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2, uVar23 - 1 < uVar14)) {
      if (uVar14 % uVar23 != 0) {
        pcVar16 = 
        "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
        ;
        goto LAB_0012e0b8;
      }
      uVar15 = local_a0 / (uVar14 / uVar23);
      if (local_a0 % (uVar14 / uVar23) == 0) goto LAB_0012dfeb;
      pcVar16 = 
      "bool ViconDataStreamSDK::Core::(anonymous namespace)::GetSampleCount(const std::vector<TFrame> &, const ViconCGStream::VChannelInfo &, const ViconCGStreamType::UInt64, const ViconCGStreamType::UInt64, const TPeriod &, unsigned int &) [TFrame = ViconCGStream::VCentreOfPressureFrame]"
      ;
      goto LAB_0012e0d7;
    }
  }
LAB_0012e03b:
  *pbVar8 = bVar9;
LAB_0012e03d:
  EVar21 = Success;
LAB_0012dc96:
  if (local_60.is_locked == true) {
    boost::recursive_mutex::unlock(local_60.m);
  }
  return EVar21;
}

Assistant:

Result::Enum VClient::GetDeviceOutputSubsamples( const std::string  & i_rDeviceName,
                                                 const std::string  & i_rDeviceOutputName, 
                                                 const std::string  & i_rComponentName,
                                                       unsigned int & o_rDeviceOutputSubsamples,
                                                       bool         & o_rbOccluded ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if ( !InitGet( GetResult, o_rDeviceOutputSubsamples ) )
  {
    return GetResult; 
  }

  const ViconCGStream::VDeviceInfo * pDevice = GetDevice( i_rDeviceName, GetResult );
  if ( !pDevice )
  {
    return GetResult; 
  }
  const unsigned int DeviceID = pDevice->m_DeviceID;
  const ViconCGStreamType::UInt64 DevicePeriod = pDevice->m_FramePeriod;

  ViconCGStreamType::Int64 DeviceStartTick = GetDeviceStartTick( DeviceID );

  const TPeriod FramePeriod = GetFramePeriod( m_LatestFrame );

  // Iterate over the channels for this device
  unsigned int CurrentDeviceOutputIndex = 0;
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelIt  = m_LatestFrame.m_Channels.begin();
  std::vector< ViconCGStream::VChannelInfo >::const_iterator ChannelEnd = m_LatestFrame.m_Channels.end();
  for ( ; ChannelIt != ChannelEnd; ++ChannelIt )
  {
    const ViconCGStream::VChannelInfo & rChannel( *ChannelIt );

    // Wrong device
    if ( rChannel.m_DeviceID != DeviceID )
    {
      continue;
    }

    if ( !i_rDeviceOutputName.empty() )
    {
      if ( rChannel.m_Name != i_rDeviceOutputName )
      {
        continue;
      }
    }

    if( rChannel.m_ComponentNames.empty() )
    {
      return Result::NoFrame;
    }

    std::vector< std::string >::const_iterator ComponentIt  = rChannel.m_ComponentNames.begin();
    std::vector< std::string >::const_iterator ComponentEnd = rChannel.m_ComponentNames.end();
    for( unsigned int ComponentIndex = 0 ; ComponentIt != ComponentEnd ; ++ComponentIt, ++ComponentIndex, ++CurrentDeviceOutputIndex )
    {
      if( i_rComponentName == AdaptDeviceOutputName( *ComponentIt, CurrentDeviceOutputIndex ) )
      {
        // This is the correct component.
        // Find the correct data array.

        if( IsForcePlateForceChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Forces, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateMomentChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Moments, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else if( IsForcePlateCoPChannel( rChannel ) )
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_CentresOfPressure, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }
        else
        {
          o_rbOccluded = !GetSampleCount( m_LatestFrame.m_Voltages, rChannel, DevicePeriod, DeviceStartTick, FramePeriod, o_rDeviceOutputSubsamples );
        }

        return Result::Success;
      }
    }
  }

  return Result::InvalidDeviceOutputName;
}